

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestMultiProcessHandler::StartTestProcess(cmCTestMultiProcessHandler *this,int test)

{
  _Base_ptr __args;
  PropertiesMap *pPVar1;
  const_iterator __position;
  mapped_type pcVar2;
  pointer puVar3;
  pointer puVar4;
  cmCTest *pcVar5;
  key_type *pkVar6;
  cmCTestMultiProcessHandler *pcVar7;
  bool bVar8;
  mapped_type *ppcVar9;
  ostream *poVar10;
  mapped_type_conflict1 *pmVar11;
  cmCTestRunTest *pcVar12;
  iterator iVar13;
  long *plVar14;
  long *plVar15;
  size_type *psVar16;
  ulong uVar17;
  bool bVar18;
  string *f;
  key_type *__k;
  size_t __n;
  cmWorkingDirectory workdir;
  int local_21c;
  cmCTestRunTest *local_218;
  cmCTestMultiProcessHandler *local_210;
  string local_208;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  cmWorkingDirectory local_1a8 [2];
  ios_base local_138 [264];
  
  local_21c = test;
  if (this->HaveAffinity != 0) {
    pPVar1 = &this->Properties;
    ppcVar9 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&pPVar1->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_21c);
    if ((*ppcVar9)->WantAffinity == true) {
      local_1a8[0].OldDir._M_dataplus._M_p._0_4_ = local_21c;
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&pPVar1->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)local_1a8);
      __n = (long)(*ppcVar9)->Processors;
      if (this->ParallelLevel < (ulong)(long)(*ppcVar9)->Processors) {
        __n = this->ParallelLevel;
      }
      if (((this->HaveAffinity != 0) && (this->HaveAffinity < __n)) &&
         (ppcVar9 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&pPVar1->
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,(key_type *)local_1a8), (*ppcVar9)->WantAffinity != false)) {
        __n = this->HaveAffinity;
      }
      if ((this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_node_count < __n) {
        return false;
      }
      local_1a8[0].OldDir._M_dataplus._M_p = (pointer)0x0;
      local_1a8[0].OldDir._M_string_length = 0;
      local_1a8[0].OldDir.field_2._M_allocated_capacity = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a8,__n);
      if (__n != 0) {
        do {
          __position._M_node =
               (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          __args = __position._M_node + 1;
          if (local_1a8[0].OldDir._M_string_length ==
              local_1a8[0].OldDir.field_2._M_allocated_capacity) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_1a8,
                       (iterator)local_1a8[0].OldDir._M_string_length,(unsigned_long *)__args);
          }
          else {
            *(unsigned_long *)local_1a8[0].OldDir._M_string_length = *(unsigned_long *)__args;
            local_1a8[0].OldDir._M_string_length = local_1a8[0].OldDir._M_string_length + 8;
          }
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                              *)&this->ProcessorsAvailable,__position);
          __n = __n - 1;
        } while (__n != 0);
      }
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&pPVar1->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_21c);
      pcVar2 = *ppcVar9;
      puVar3 = (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar4 = (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1a8[0].OldDir._M_dataplus._M_p;
      (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1a8[0].OldDir._M_string_length;
      (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1a8[0].OldDir.field_2._0_8_;
      local_1a8[0].OldDir._M_dataplus._M_p = (pointer)0x0;
      local_1a8[0].OldDir._M_string_length = 0;
      local_1a8[0].OldDir.field_2._M_allocated_capacity = 0;
      if ((puVar3 != (pointer)0x0) &&
         (operator_delete(puVar3,(long)puVar4 - (long)puVar3),
         local_1a8[0].OldDir._M_dataplus._M_p != (pointer)0x0)) {
        operator_delete(local_1a8[0].OldDir._M_dataplus._M_p,
                        local_1a8[0].OldDir.field_2._M_allocated_capacity -
                        (long)local_1a8[0].OldDir._M_dataplus._M_p);
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"test ",5);
  poVar10 = (ostream *)std::ostream::operator<<(local_1a8,local_21c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  pcVar5 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x9c,local_208._M_dataplus._M_p,this->Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pmVar11 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
            operator[](&this->TestRunningMap,&local_21c);
  *pmVar11 = true;
  EraseTest(this,local_21c);
  local_1a8[0].OldDir._M_dataplus._M_p._0_4_ = local_21c;
  pPVar1 = &this->Properties;
  ppcVar9 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&pPVar1->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)local_1a8);
  uVar17 = (long)(*ppcVar9)->Processors;
  if (this->ParallelLevel < (ulong)(long)(*ppcVar9)->Processors) {
    uVar17 = this->ParallelLevel;
  }
  local_210 = this;
  if (((this->HaveAffinity != 0) && (this->HaveAffinity < uVar17)) &&
     (ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&pPVar1->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)local_1a8), (*ppcVar9)->WantAffinity != false)) {
    uVar17 = local_210->HaveAffinity;
  }
  pcVar7 = local_210;
  local_210->RunningCount = local_210->RunningCount + uVar17;
  pcVar12 = (cmCTestRunTest *)operator_new(0x228);
  cmCTestRunTest::cmCTestRunTest(pcVar12,pcVar7);
  pcVar5 = pcVar7->CTest;
  if (pcVar5->RepeatUntilFail == true) {
    pcVar12->RunUntilFail = true;
    pcVar12->NumberOfRunsLeft = pcVar5->RepeatTests;
  }
  pcVar12->Index = local_21c;
  ppcVar9 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&pPVar1->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_21c);
  pcVar12->TestProperties = *ppcVar9;
  __k = (pcVar7->Failed->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pkVar6 = (pcVar7->Failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_218 = pcVar12;
  if (__k != pkVar6) {
    do {
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&pPVar1->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_21c);
      iVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&((*ppcVar9)->RequireSuccessDepends)._M_t,__k);
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&pPVar1->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_21c);
      if ((_Rb_tree_header *)iVar13._M_node !=
          &((*ppcVar9)->RequireSuccessDepends)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pcVar12->FailedDependencies,__k);
      }
      __k = __k + 1;
    } while (__k != pkVar6);
  }
  pcVar7 = local_210;
  LockResources(local_210,local_21c);
  ppcVar9 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&pPVar1->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_21c);
  cmWorkingDirectory::cmWorkingDirectory(local_1a8,&(*ppcVar9)->Directory);
  pcVar12 = local_218;
  if (local_1a8[0].ResultCode == 0) {
    bVar8 = cmCTestRunTest::StartTest(local_218,pcVar7->Completed,pcVar7->Total);
    bVar18 = true;
    if (bVar8) goto LAB_001dba14;
  }
  else {
    ppcVar9 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&pPVar1->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_21c);
    pcVar12 = local_218;
    std::operator+(&local_1c8,"Failed to change working directory to ",&(*ppcVar9)->Directory);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    plVar15 = plVar14 + 2;
    if ((long *)*plVar14 == plVar15) {
      local_1d8 = *plVar15;
      lStack_1d0 = plVar14[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *plVar15;
      local_1e8 = (long *)*plVar14;
    }
    local_1e0 = plVar14[1];
    *plVar14 = (long)plVar15;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    strerror(local_1a8[0].ResultCode);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    psVar16 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_208.field_2._M_allocated_capacity = *psVar16;
      local_208.field_2._8_8_ = plVar14[3];
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar16;
      local_208._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_208._M_string_length = plVar14[1];
    *plVar14 = (long)psVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    cmCTestRunTest::StartFailure(pcVar12,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  bVar18 = false;
  FinishTestProcess(pcVar7,pcVar12,false);
LAB_001dba14:
  cmWorkingDirectory::~cmWorkingDirectory(local_1a8);
  return bVar18;
}

Assistant:

bool cmCTestMultiProcessHandler::StartTestProcess(int test)
{
  if (this->HaveAffinity && this->Properties[test]->WantAffinity) {
    size_t needProcessors = this->GetProcessorsUsed(test);
    if (needProcessors > this->ProcessorsAvailable.size()) {
      return false;
    }
    std::vector<size_t> affinity;
    affinity.reserve(needProcessors);
    for (size_t i = 0; i < needProcessors; ++i) {
      auto p = this->ProcessorsAvailable.begin();
      affinity.push_back(*p);
      this->ProcessorsAvailable.erase(p);
    }
    this->Properties[test]->Affinity = std::move(affinity);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "test " << test << "\n", this->Quiet);
  this->TestRunningMap[test] = true; // mark the test as running
  // now remove the test itself
  this->EraseTest(test);
  this->RunningCount += GetProcessorsUsed(test);

  cmCTestRunTest* testRun = new cmCTestRunTest(*this);
  if (this->CTest->GetRepeatUntilFail()) {
    testRun->SetRunUntilFailOn();
    testRun->SetNumberOfRuns(this->CTest->GetTestRepeat());
  }
  testRun->SetIndex(test);
  testRun->SetTestProperties(this->Properties[test]);

  // Find any failed dependencies for this test. We assume the more common
  // scenario has no failed tests, so make it the outer loop.
  for (std::string const& f : *this->Failed) {
    if (this->Properties[test]->RequireSuccessDepends.find(f) !=
        this->Properties[test]->RequireSuccessDepends.end()) {
      testRun->AddFailedDependency(f);
    }
  }

  // Always lock the resources we'll be using, even if we fail to set the
  // working directory because FinishTestProcess() will try to unlock them
  this->LockResources(test);

  cmWorkingDirectory workdir(this->Properties[test]->Directory);
  if (workdir.Failed()) {
    testRun->StartFailure("Failed to change working directory to " +
                          this->Properties[test]->Directory + " : " +
                          std::strerror(workdir.GetLastResult()));
  } else {
    if (testRun->StartTest(this->Completed, this->Total)) {
      return true;
    }
  }

  this->FinishTestProcess(testRun, false);
  return false;
}